

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O2

lu_int basiclu_obj_update(basiclu_object *obj,double xtbl)

{
  lu_int lVar1;
  int iVar2;
  
  lVar1 = isvalid(obj);
  if (lVar1 == 0) {
    iVar2 = -8;
  }
  else {
    iVar2 = 0;
    while (iVar2 == 0) {
      lVar1 = basiclu_update(obj->istore,obj->xstore,obj->Li,obj->Lx,obj->Ui,obj->Ux,obj->Wi,obj->Wx
                             ,xtbl);
      if (lVar1 != 1) {
        return lVar1;
      }
      iVar2 = lu_realloc_obj(obj);
    }
  }
  return iVar2;
}

Assistant:

lu_int basiclu_obj_update(struct basiclu_object *obj, double xtbl)
{
    lu_int status = BASICLU_OK;

    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    while (status == BASICLU_OK)
    {
        status = basiclu_update(obj->istore, obj->xstore, obj->Li, obj->Lx,
                                obj->Ui, obj->Ux, obj->Wi, obj->Wx, xtbl);
        if (status != BASICLU_REALLOCATE)
            break;
        status = lu_realloc_obj(obj);
    }

    return status;
}